

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_link_resolver.c
# Opt level: O0

void archive_entry_linkify(archive_entry_linkresolver *res,archive_entry **e,archive_entry **f)

{
  uint uVar1;
  mode_t mVar2;
  links_entry *plVar3;
  archive_entry *paVar4;
  undefined8 *in_RDX;
  archive_entry *in_RSI;
  archive_entry_linkresolver *in_RDI;
  archive_entry *t;
  links_entry *le;
  archive_entry *in_stack_ffffffffffffffb8;
  archive_entry *in_stack_ffffffffffffffc0;
  archive_entry_linkresolver *in_stack_ffffffffffffffc8;
  archive_entry_linkresolver *in_stack_ffffffffffffffd8;
  
  *in_RDX = 0;
  if (in_RSI->archive == (archive_conflict *)0x0) {
    plVar3 = next_entry(in_stack_ffffffffffffffc8,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    if (plVar3 != (links_entry *)0x0) {
      in_RSI->archive = (archive_conflict *)plVar3->entry;
      plVar3->entry = (archive_entry *)0x0;
    }
  }
  else {
    uVar1 = archive_entry_nlink((archive_entry *)in_RSI->archive);
    if ((((uVar1 != 1) &&
         (mVar2 = archive_entry_filetype((archive_entry *)in_RSI->archive), mVar2 != 0x4000)) &&
        (mVar2 = archive_entry_filetype((archive_entry *)in_RSI->archive), mVar2 != 0x6000)) &&
       (mVar2 = archive_entry_filetype((archive_entry *)in_RSI->archive), mVar2 != 0x2000)) {
      paVar4 = (archive_entry *)(ulong)(uint)in_RDI->strategy;
      switch(paVar4) {
      case (archive_entry *)0x0:
        plVar3 = find_entry(in_RDI,in_RSI);
        if (plVar3 == (links_entry *)0x0) {
          insert_entry(in_stack_ffffffffffffffd8,paVar4);
        }
        else {
          archive_entry_unset_size((archive_entry *)0x116e19);
          archive_entry_pathname(in_stack_ffffffffffffffb8);
          archive_entry_copy_hardlink(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
        }
        break;
      case (archive_entry *)0x1:
        plVar3 = find_entry(in_RDI,in_RSI);
        if (plVar3 == (links_entry *)0x0) {
          insert_entry(in_stack_ffffffffffffffd8,paVar4);
        }
        else {
          paVar4 = (archive_entry *)in_RSI->archive;
          archive_entry_pathname(in_stack_ffffffffffffffb8);
          archive_entry_copy_hardlink(paVar4,(char *)in_stack_ffffffffffffffb8);
        }
        break;
      case (archive_entry *)0x2:
        break;
      case (archive_entry *)0x3:
        plVar3 = find_entry(in_RDI,in_RSI);
        if (plVar3 == (links_entry *)0x0) {
          plVar3 = insert_entry(in_stack_ffffffffffffffd8,paVar4);
          if (plVar3 != (links_entry *)0x0) {
            plVar3->entry = (archive_entry *)in_RSI->archive;
            in_RSI->archive = (archive_conflict *)0x0;
          }
        }
        else {
          paVar4 = (archive_entry *)in_RSI->archive;
          in_RSI->archive = (archive_conflict *)plVar3->entry;
          plVar3->entry = paVar4;
          archive_entry_unset_size((archive_entry *)0x116f1b);
          paVar4 = (archive_entry *)in_RSI->archive;
          archive_entry_pathname(paVar4);
          archive_entry_copy_hardlink(in_stack_ffffffffffffffc0,(char *)paVar4);
          if (plVar3->links == 0) {
            *in_RDX = plVar3->entry;
            plVar3->entry = (archive_entry *)0x0;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
archive_entry_linkify(struct archive_entry_linkresolver *res,
    struct archive_entry **e, struct archive_entry **f)
{
	struct links_entry *le;
	struct archive_entry *t;

	*f = NULL; /* Default: Don't return a second entry. */

	if (*e == NULL) {
		le = next_entry(res, NEXT_ENTRY_DEFERRED);
		if (le != NULL) {
			*e = le->entry;
			le->entry = NULL;
		}
		return;
	}

	/* If it has only one link, then we're done. */
	if (archive_entry_nlink(*e) == 1)
		return;
	/* Directories, devices never have hardlinks. */
	if (archive_entry_filetype(*e) == AE_IFDIR
	    || archive_entry_filetype(*e) == AE_IFBLK
	    || archive_entry_filetype(*e) == AE_IFCHR)
		return;

	switch (res->strategy) {
	case ARCHIVE_ENTRY_LINKIFY_LIKE_TAR:
		le = find_entry(res, *e);
		if (le != NULL) {
			archive_entry_unset_size(*e);
			archive_entry_copy_hardlink(*e,
			    archive_entry_pathname(le->canonical));
		} else
			insert_entry(res, *e);
		return;
	case ARCHIVE_ENTRY_LINKIFY_LIKE_MTREE:
		le = find_entry(res, *e);
		if (le != NULL) {
			archive_entry_copy_hardlink(*e,
			    archive_entry_pathname(le->canonical));
		} else
			insert_entry(res, *e);
		return;
	case ARCHIVE_ENTRY_LINKIFY_LIKE_OLD_CPIO:
		/* This one is trivial. */
		return;
	case ARCHIVE_ENTRY_LINKIFY_LIKE_NEW_CPIO:
		le = find_entry(res, *e);
		if (le != NULL) {
			/*
			 * Put the new entry in le, return the
			 * old entry from le.
			 */
			t = *e;
			*e = le->entry;
			le->entry = t;
			/* Make the old entry into a hardlink. */
			archive_entry_unset_size(*e);
			archive_entry_copy_hardlink(*e,
			    archive_entry_pathname(le->canonical));
			/* If we ran out of links, return the
			 * final entry as well. */
			if (le->links == 0) {
				*f = le->entry;
				le->entry = NULL;
			}
		} else {
			/*
			 * If we haven't seen it, tuck it away
			 * for future use.
			 */
			le = insert_entry(res, *e);
			if (le == NULL)
				/* XXX We should return an error code XXX */
				return;
			le->entry = *e;
			*e = NULL;
		}
		return;
	default:
		break;
	}
	return;
}